

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf.cpp
# Opt level: O0

void __thiscall QPdf::ByteStream::prepareBuffer(ByteStream *this)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  QTemporaryFile *this_00;
  long lVar5;
  int __oflag;
  char *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QTemporaryFile *newFile;
  qint64 size;
  QByteArray buf;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (**(code **)(*(long *)*in_RDI + 0x80))();
  if ((((*(byte *)(in_RDI + 4) & 1) != 0) && ((*(byte *)((long)in_RDI + 0x21) & 1) == 0)) &&
     (iVar2 = maxMemorySize(), iVar2 < lVar4)) {
    this_00 = (QTemporaryFile *)operator_new(0x10);
    QTemporaryFile::QTemporaryFile(this_00);
    uVar3 = QTemporaryFile::open(this_00,in_RSI,__oflag);
    if ((uVar3 & 1) != 0) {
      (**(code **)(*(long *)*in_RDI + 0x98))();
      while (bVar1 = (**(code **)(*(long *)*in_RDI + 0x90))(), ((bVar1 ^ 0xff) & 1) != 0) {
        local_20 = &DAT_aaaaaaaaaaaaaaaa;
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        local_10 = &DAT_aaaaaaaaaaaaaaaa;
        chunkSize();
        QIODevice::read((longlong)&local_20);
        QIODevice::write((QByteArray *)this_00);
        QByteArray::~QByteArray((QByteArray *)0x5f0d38);
      }
      if ((long *)*in_RDI != (long *)0x0) {
        (**(code **)(*(long *)*in_RDI + 0x20))();
      }
      *in_RDI = (long)this_00;
      QByteArray::clear();
      *(undefined1 *)((long)in_RDI + 0x21) = 1;
    }
  }
  lVar5 = (**(code **)(*(long *)*in_RDI + 0x78))();
  if (lVar5 != lVar4) {
    (**(code **)(*(long *)*in_RDI + 0x88))((long *)*in_RDI,lVar4);
    *(undefined1 *)((long)in_RDI + 0x22) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ByteStream::prepareBuffer()
    {
        Q_ASSERT(!dev->isSequential());
        qint64 size = dev->size();
        if (fileBackingEnabled && !fileBackingActive
                && size > maxMemorySize()) {
            // Switch to file backing.
            QTemporaryFile *newFile = new QTemporaryFile;
            if (newFile->open()) {
                dev->reset();
                while (!dev->atEnd()) {
                    QByteArray buf = dev->read(chunkSize());
                    newFile->write(buf);
                }
                delete dev;
                dev = newFile;
                ba.clear();
                fileBackingActive = true;
            }
        }
        if (dev->pos() != size) {
            dev->seek(size);
            handleDirty = false;
        }
    }